

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

string * __thiscall
toml::Value::
ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::to
          (ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Value *v)

{
  char *local_10;
  char *local_8;
  
  if (v->type_ == STRING_TYPE) {
    return (string *)(v->field_1).null_;
  }
  local_8 = typeToString(v->type_);
  local_10 = "string";
  failwith<char_const(&)[27],char_const*,char_const(&)[6],char_const*,char_const(&)[15]>
            ((char (*) [27])"type error: this value is ",&local_8,(char (*) [6])" but ",&local_10,
             (char (*) [15])" was requested");
}

Assistant:

Type type() const { return type_; }